

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

LY_ERR ly_dup_prefix_data(ly_ctx *ctx,LY_VALUE_FORMAT format,void *prefix_data,void **prefix_data_p)

{
  long lVar1;
  void **ppvVar2;
  long *plVar3;
  char *pcVar4;
  lys_module *plVar5;
  lyd_node **local_b8;
  lyd_node **local_a8;
  long local_98;
  char *p__;
  uint64_t u;
  uint32_t i;
  ly_set *orig_ns;
  ly_set *ns_list;
  lysc_prefix *orig_pref;
  lysc_prefix *prefixes;
  lyxml_ns *ns;
  void **ppvStack_28;
  LY_ERR ret;
  void **prefix_data_p_local;
  void *prefix_data_local;
  ly_ctx *plStack_10;
  LY_VALUE_FORMAT format_local;
  ly_ctx *ctx_local;
  
  ns._4_4_ = LY_SUCCESS;
  orig_pref = (lysc_prefix *)0x0;
  ppvStack_28 = prefix_data_p;
  prefix_data_p_local = (void **)prefix_data;
  prefix_data_local._4_4_ = format;
  plStack_10 = ctx;
  if (*prefix_data_p != (void *)0x0) {
    __assert_fail("!*prefix_data_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                  ,0x581,
                  "LY_ERR ly_dup_prefix_data(const struct ly_ctx *, LY_VALUE_FORMAT, const void *, void **)"
                 );
  }
  switch(format) {
  case LY_VALUE_CANON:
  case LY_VALUE_JSON:
  case LY_VALUE_LYB:
    if (prefix_data != (void *)0x0) {
      __assert_fail("!prefix_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                    ,0x5ad,
                    "LY_ERR ly_dup_prefix_data(const struct ly_ctx *, LY_VALUE_FORMAT, const void *, void **)"
                   );
    }
    *prefix_data_p = (void *)0x0;
    break;
  case LY_VALUE_SCHEMA:
    *prefix_data_p = prefix_data;
    break;
  case LY_VALUE_SCHEMA_RESOLVED:
    if (prefix_data == (void *)0x0) {
      local_98 = 0;
    }
    else {
      local_98 = *(long *)((long)prefix_data + -8);
    }
    ns_list = (ly_set *)prefix_data;
    plVar3 = (long *)calloc(1,local_98 * 0x10 + 8);
    if (plVar3 != (long *)0x0) {
      orig_pref = (lysc_prefix *)(plVar3 + 1);
      if (orig_pref != (lysc_prefix *)0x0) {
        if (ns_list == (ly_set *)0x0) {
          local_a8 = (lyd_node **)0x0;
        }
        else {
          local_a8 = ns_list[-1].field_2.dnodes;
        }
        memset(orig_pref + *plVar3,0,(long)local_a8 << 4);
      }
      *ppvStack_28 = orig_pref;
      p__ = (char *)0x0;
      do {
        if (ns_list == (ly_set *)0x0) {
          local_b8 = (lyd_node **)0x0;
        }
        else {
          local_b8 = ns_list[-1].field_2.dnodes;
        }
        if (local_b8 <= p__) goto switchD_0013afc7_default;
        lVar1._0_4_ = ns_list[(long)p__].size;
        lVar1._4_4_ = ns_list[(long)p__].count;
        if (lVar1 != 0) {
          pcVar4 = strdup(*(char **)(ns_list + (long)p__));
          orig_pref[(long)p__].prefix = pcVar4;
          if (orig_pref[(long)p__].prefix == (char *)0x0) goto code_r0x0013b213;
        }
        orig_pref[(long)p__].mod = (lys_module *)ns_list[(long)p__].field_2;
        orig_pref[-1].mod = (lys_module *)((long)&(orig_pref[-1].mod)->ctx + 1);
        p__ = p__ + 1;
      } while( true );
    }
    ly_log(plStack_10,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_dup_prefix_data");
    ns._4_4_ = LY_EMEM;
    break;
  case LY_VALUE_XML:
  case LY_VALUE_STR_NS:
    ns._4_4_ = ly_set_new(&orig_ns);
    ppvVar2 = prefix_data_p_local;
    if (ns._4_4_ == LY_SUCCESS) {
      *ppvStack_28 = orig_ns;
      for (u._4_4_ = 0; u._4_4_ < *(uint *)((long)ppvVar2 + 4); u._4_4_ = u._4_4_ + 1) {
        prefixes = (lysc_prefix *)calloc(1,0x18);
        if (prefixes == (lysc_prefix *)0x0) {
          ly_log(plStack_10,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_dup_prefix_data"
                );
          ns._4_4_ = LY_EMEM;
          break;
        }
        ns._4_4_ = ly_set_add(orig_ns,prefixes,'\x01',(uint32_t *)0x0);
        if (ns._4_4_ != LY_SUCCESS) break;
        if (**(long **)((long)ppvVar2[1] + (ulong)u._4_4_ * 8) != 0) {
          pcVar4 = strdup((char *)**(undefined8 **)((long)ppvVar2[1] + (ulong)u._4_4_ * 8));
          prefixes->prefix = pcVar4;
          if (prefixes->prefix == (char *)0x0) {
            ly_log(plStack_10,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "ly_dup_prefix_data");
            ns._4_4_ = LY_EMEM;
            break;
          }
        }
        plVar5 = (lys_module *)
                 strdup(*(char **)(*(long *)((long)ppvVar2[1] + (ulong)u._4_4_ * 8) + 8));
        prefixes->mod = plVar5;
        if (prefixes->mod == (lys_module *)0x0) {
          ly_log(plStack_10,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_dup_prefix_data"
                );
          ns._4_4_ = LY_EMEM;
          break;
        }
      }
    }
  }
switchD_0013afc7_default:
  if (ns._4_4_ != LY_SUCCESS) {
    ly_free_prefix_data(prefix_data_local._4_4_,*ppvStack_28);
    *ppvStack_28 = (void *)0x0;
  }
  return ns._4_4_;
code_r0x0013b213:
  ly_log(plStack_10,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_dup_prefix_data");
  ns._4_4_ = LY_EMEM;
  goto switchD_0013afc7_default;
}

Assistant:

LY_ERR
ly_dup_prefix_data(const struct ly_ctx *ctx, LY_VALUE_FORMAT format, const void *prefix_data,
        void **prefix_data_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxml_ns *ns;
    struct lysc_prefix *prefixes = NULL, *orig_pref;
    struct ly_set *ns_list, *orig_ns;
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u;

    assert(!*prefix_data_p);

    switch (format) {
    case LY_VALUE_SCHEMA:
        *prefix_data_p = (void *)prefix_data;
        break;
    case LY_VALUE_SCHEMA_RESOLVED:
        /* copy all the value prefixes */
        orig_pref = (struct lysc_prefix *)prefix_data;
        LY_ARRAY_CREATE_GOTO(ctx, prefixes, LY_ARRAY_COUNT(orig_pref), ret, cleanup);
        *prefix_data_p = prefixes;

        LY_ARRAY_FOR(orig_pref, u) {
            if (orig_pref[u].prefix) {
                prefixes[u].prefix = strdup(orig_pref[u].prefix);
                LY_CHECK_ERR_GOTO(!prefixes[u].prefix, LOGMEM(ctx); ret = LY_EMEM, cleanup);
            }
            prefixes[u].mod = orig_pref[u].mod;
            LY_ARRAY_INCREMENT(prefixes);
        }
        break;
    case LY_VALUE_XML:
    case LY_VALUE_STR_NS:
        /* copy all the namespaces */
        LY_CHECK_GOTO(ret = ly_set_new(&ns_list), cleanup);
        *prefix_data_p = ns_list;

        orig_ns = (struct ly_set *)prefix_data;
        for (i = 0; i < orig_ns->count; ++i) {
            ns = calloc(1, sizeof *ns);
            LY_CHECK_ERR_GOTO(!ns, LOGMEM(ctx); ret = LY_EMEM, cleanup);
            LY_CHECK_GOTO(ret = ly_set_add(ns_list, ns, 1, NULL), cleanup);

            if (((struct lyxml_ns *)orig_ns->objs[i])->prefix) {
                ns->prefix = strdup(((struct lyxml_ns *)orig_ns->objs[i])->prefix);
                LY_CHECK_ERR_GOTO(!ns->prefix, LOGMEM(ctx); ret = LY_EMEM, cleanup);
            }
            ns->uri = strdup(((struct lyxml_ns *)orig_ns->objs[i])->uri);
            LY_CHECK_ERR_GOTO(!ns->uri, LOGMEM(ctx); ret = LY_EMEM, cleanup);
        }
        break;
    case LY_VALUE_CANON:
    case LY_VALUE_JSON:
    case LY_VALUE_LYB:
        assert(!prefix_data);
        *prefix_data_p = NULL;
        break;
    }

cleanup:
    if (ret) {
        ly_free_prefix_data(format, *prefix_data_p);
        *prefix_data_p = NULL;
    }
    return ret;
}